

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

bool __thiscall nuraft::raft_server::request_leadership(raft_server *this)

{
  atomic<int> *__args_4;
  element_type *peVar1;
  int iVar2;
  iterator iVar3;
  long lVar4;
  int local_ac;
  string local_a8;
  ptr<custom_notification_msg> custom_noti;
  undefined1 local_78 [8];
  ptr<log_entry> custom_noti_le;
  ptr<req_msg> req;
  ptr<peer> pp;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_40;
  unique_lock<std::recursive_mutex> guard;
  
  if (this->id_ != (this->leader_).super___atomic_base<int>._M_i) {
    __args_4 = &this->leader_;
    if (((__args_4->super___atomic_base<int>)._M_i != this->id_) || ((this->role_)._M_i != leader))
    {
      if ((__args_4->super___atomic_base<int>)._M_i != -1) {
        std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
        local_a8._M_dataplus._M_p._0_4_ = (this->leader_).super___atomic_base<int>._M_i;
        iVar3 = std::
                _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->peers_)._M_h,(key_type *)&local_a8);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
            _M_cur == (__node_type *)0x0) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (iVar2 = (**(code **)(*(long *)peVar1 + 0x38))(), 1 < iVar2)) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_a8,"cannot request leadership: cannot find peer for leader id %d",
                       (ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
            (**(code **)(*(long *)peVar1 + 0x40))
                      (peVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"request_leadership",0x506,&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
          }
        }
        else {
          std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)iVar3.
                            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                            ._M_cur + 0x10));
          local_a8._M_dataplus._M_p =
               (pointer)(((this->state_).
                          super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->term_).super___atomic_base<unsigned_long>._M_i;
          local_ac = 0x1c;
          lVar4 = (**(code **)(*(long *)(this->log_store_).
                                        super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x10))();
          custom_noti.
          super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)term_for_log(this,lVar4 - 1);
          lVar4 = (**(code **)(*(long *)(this->log_store_).
                                        super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x10))();
          custom_noti_le.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(lVar4 + -1);
          local_78 = (undefined1  [8])
                     (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
          std::
          make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,std::atomic<int>&,unsigned_long,unsigned_long,unsigned_long>
                    ((unsigned_long *)&req,(msg_type *)&local_a8,&local_ac,(atomic<int> *)&this->id_
                     ,(unsigned_long *)__args_4,(unsigned_long *)&custom_noti,
                     (unsigned_long *)&custom_noti_le);
          local_a8._M_dataplus._M_p._0_4_ = 3;
          std::make_shared<nuraft::custom_notification_msg,nuraft::custom_notification_msg::type>
                    ((type *)&custom_noti);
          local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
          custom_notification_msg::serialize((custom_notification_msg *)&local_a8);
          local_ac = CONCAT31(local_ac._1_3_,0xe7);
          std::
          make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                    ((int *)&custom_noti_le,(shared_ptr<nuraft::buffer> *)local_78,
                     (log_val_type *)&local_a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
          std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->log_entries_,&custom_noti_le);
          std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
          peer::send_req(pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ptr<peer> *)&local_40,&req,&this->resp_handler_);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (iVar2 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar2)) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_a8,"sent leadership request to leader %d",
                       (ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
            (**(code **)(*(long *)peVar1 + 0x40))
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"request_leadership",0x51f,&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&custom_noti_le.
                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&custom_noti.
                      super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&pp.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
        return iVar3.
               super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
               ._M_cur != (__node_type *)0x0;
      }
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        return false;
      }
      iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
      if (iVar2 < 2) {
        return false;
      }
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_a8,"cannot request leadership: cannot find leader");
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"request_leadership",0x4fe,&local_a8);
      goto LAB_001201d0;
    }
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    return false;
  }
  iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
  if (iVar2 < 2) {
    return false;
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  msg_if_given_abi_cxx11_(&local_a8,"cannot request leadership: this server is already a leader");
  (**(code **)(*(long *)peVar1 + 0x40))
            (peVar1,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
             ,"request_leadership",0x4fa,&local_a8);
LAB_001201d0:
  std::__cxx11::string::~string((string *)&local_a8);
  return false;
}

Assistant:

bool raft_server::request_leadership() {
    // If this server is already a leader, do nothing.
    if (id_ == leader_ || is_leader()) {
        p_er("cannot request leadership: this server is already a leader");
        return false;
    }
    if (leader_ == -1) {
        p_er("cannot request leadership: cannot find leader");
        return false;
    }

    recur_lock(lock_);
    auto entry = peers_.find(leader_);
    if (entry == peers_.end()) {
        p_er("cannot request leadership: cannot find peer for "
             "leader id %d", leader_.load());
        return false;
    }
    ptr<peer> pp = entry->second;

    // Send resignation message to the follower.
    ptr<req_msg> req = cs_new<req_msg>
                       ( state_->get_term(),
                         msg_type::custom_notification_request,
                         id_, leader_,
                         term_for_log(log_store_->next_slot() - 1),
                         log_store_->next_slot() - 1,
                         quick_commit_index_.load() );

    // Create a notification.
    ptr<custom_notification_msg> custom_noti =
        cs_new<custom_notification_msg>
        ( custom_notification_msg::request_resignation );

    // Wrap it using log_entry.
    ptr<log_entry> custom_noti_le =
        cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

    req->log_entries().push_back(custom_noti_le);
    pp->send_req(pp, req, resp_handler_);
    p_in("sent leadership request to leader %d", leader_.load());
    return true;
}